

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O2

U32 __thiscall
HdmiCecSimulationDataGenerator::GenerateSimulationData
          (HdmiCecSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channel)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar1 <= uVar2) break;
    SetRandomErrorType(this);
    GenVersionTransaction(this);
    AdvanceRand(this,5.0,15.0);
    SetRandomErrorType(this);
    GetStandbyTransaction(this);
    AdvanceRand(this,5.0,15.0);
    SetRandomErrorType(this);
    GetInitTransaction(this);
    AdvanceRand(this,5.0,15.0);
  }
  *simulation_channel = &this->mCecSimulationData;
  return 1;
}

Assistant:

U32 HdmiCecSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                            SimulationChannelDescriptor** simulation_channel )
{
    const U64 lastSample = AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mCecSimulationData.GetCurrentSampleNumber() < lastSample )
    {
        SetRandomErrorType();
        GenVersionTransaction();
        AdvanceRand( 5.0f, 15.0f );

        SetRandomErrorType();
        GetStandbyTransaction();
        AdvanceRand( 5.0f, 15.0f );

        SetRandomErrorType();
        GetInitTransaction();
        AdvanceRand( 5.0f, 15.0f );
    }

    *simulation_channel = &mCecSimulationData;
    return 1; // We are simulating one channel
}